

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::anon_unknown_1::DrawTestShaderProgram::DrawTestShaderProgram
          (DrawTestShaderProgram *this,RenderContext *ctx,
          vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
          *arrays)

{
  bool __x;
  int iVar1;
  GenericVecType GVar2;
  size_type sVar3;
  const_reference ppAVar4;
  reference pvVar5;
  reference pvVar6;
  reference rVar7;
  OutputType local_15c;
  reference local_158;
  OutputType local_148;
  int local_144;
  allocator<rr::GenericVecType> local_13f;
  allocator<bool> local_13e;
  allocator<int> local_13d;
  int arrayNdx;
  ShaderProgramDeclaration local_130;
  vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
  *local_20;
  vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
  *arrays_local;
  RenderContext *ctx_local;
  DrawTestShaderProgram *this_local;
  
  local_20 = arrays;
  arrays_local = (vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
                  *)ctx;
  ctx_local = (RenderContext *)this;
  createProgramDeclaration(&local_130,ctx,arrays);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,&local_130);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_130);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_032e6d80;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_032e6db8;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032e6dd0;
  sVar3 = std::
          vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
          ::size(local_20);
  std::allocator<int>::allocator(&local_13d);
  std::vector<int,_std::allocator<int>_>::vector(&this->m_componentCount,sVar3,&local_13d);
  std::allocator<int>::~allocator(&local_13d);
  sVar3 = std::
          vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
          ::size(local_20);
  std::allocator<bool>::allocator(&local_13e);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->m_isCoord,sVar3,&local_13e);
  std::allocator<bool>::~allocator(&local_13e);
  sVar3 = std::
          vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
          ::size(local_20);
  std::allocator<rr::GenericVecType>::allocator(&local_13f);
  std::vector<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>::vector
            (&this->m_attrType,sVar3,&local_13f);
  std::allocator<rr::GenericVecType>::~allocator(&local_13f);
  local_144 = 0;
  while( true ) {
    iVar1 = local_144;
    sVar3 = std::
            vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
            ::size(local_20);
    if ((int)sVar3 <= iVar1) break;
    ppAVar4 = std::
              vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
              ::operator[](local_20,(long)local_144);
    local_148 = AttributeArray::getOutputType(*ppAVar4);
    iVar1 = getComponentCount(&local_148);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_componentCount,(long)local_144);
    *pvVar5 = iVar1;
    ppAVar4 = std::
              vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
              ::operator[](local_20,(long)local_144);
    __x = AttributeArray::isPositionAttribute(*ppAVar4);
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->m_isCoord,(long)local_144);
    local_158 = rVar7;
    std::_Bit_reference::operator=(&local_158,__x);
    ppAVar4 = std::
              vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
              ::operator[](local_20,(long)local_144);
    local_15c = AttributeArray::getOutputType(*ppAVar4);
    GVar2 = mapOutputType(&local_15c);
    pvVar6 = std::vector<rr::GenericVecType,_std::allocator<rr::GenericVecType>_>::operator[]
                       (&this->m_attrType,(long)local_144);
    *pvVar6 = GVar2;
    local_144 = local_144 + 1;
  }
  return;
}

Assistant:

DrawTestShaderProgram::DrawTestShaderProgram (const glu::RenderContext& ctx, const std::vector<AttributeArray*>& arrays)
	: sglr::ShaderProgram	(createProgramDeclaration(ctx, arrays))
	, m_componentCount		(arrays.size())
	, m_isCoord				(arrays.size())
	, m_attrType			(arrays.size())
{
	for (int arrayNdx = 0; arrayNdx < (int)arrays.size(); arrayNdx++)
	{
		m_componentCount[arrayNdx]	= getComponentCount(arrays[arrayNdx]->getOutputType());
		m_isCoord[arrayNdx]			= arrays[arrayNdx]->isPositionAttribute();
		m_attrType[arrayNdx]		= mapOutputType(arrays[arrayNdx]->getOutputType());
	}
}